

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall ObjectTempVerify::MergeDeadData(ObjectTempVerify *this,BasicBlock *block)

{
  BasicBlock *block_local;
  ObjectTempVerify *this_local;
  
  MergeData(this,&block->tempObjectVerifyTracker->super_ObjectTempVerify,false);
  if (((*(ushort *)&block->field_0x18 >> 1 & 1) == 0) &&
     (BVSparse<Memory::JitArenaAllocator>::Or
                (&this->removedUpwardExposedUse,block->upwardExposedUses),
     block->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    BVSparse<Memory::JitArenaAllocator>::Or
              (&this->removedUpwardExposedUse,block->byteCodeUpwardExposedUsed);
  }
  return;
}

Assistant:

void
ObjectTempVerify::MergeDeadData(BasicBlock * block)
{
    MergeData(block->tempObjectVerifyTracker, false);
    if (!block->isDead)
    {
        // If there was dead flow to a block that is not dead, it might expose
        // new mark temp object, so all its current used (upwardExposedUsed) and optimized
        // use (byteCodeupwardExposedUsed) might not be trace for "missed" mark temp object
        this->removedUpwardExposedUse.Or(block->upwardExposedUses);
        if (block->byteCodeUpwardExposedUsed)
        {
            this->removedUpwardExposedUse.Or(block->byteCodeUpwardExposedUsed);
        }
    }
}